

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.h
# Opt level: O2

void __thiscall asl::HttpMessage::put(HttpMessage *this,char *body)

{
  size_t sVar1;
  Array<unsigned_char> local_20;
  
  sVar1 = strlen(body);
  Array<unsigned_char>::Array(&local_20,(uchar *)body,(int)sVar1);
  put(this,&local_20);
  Array<unsigned_char>::~Array(&local_20);
  return;
}

Assistant:

void put(const char* body) { put(ByteArray((const byte*)body, (int)strlen(body))); }